

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfWrite.c
# Opt level: O3

Cnf_Dat_t * Cnf_DeriveSimpleForRetiming(Aig_Man_t *p)

{
  void **ppvVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  void *pvVar4;
  undefined1 auVar5 [16];
  Cnf_Dat_t *pCVar6;
  int **ppiVar7;
  int *piVar8;
  int *piVar9;
  long lVar10;
  Aig_Obj_t *pAVar11;
  Vec_Ptr_t *pVVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar23;
  long lVar20;
  
  iVar17 = p->nObjs[6] + p->nObjs[5];
  iVar13 = iVar17 * 7 + p->nObjs[3] * 5 + 1;
  iVar17 = iVar17 + p->nObjs[3];
  iVar15 = iVar17 * 3 + 1;
  pCVar6 = (Cnf_Dat_t *)calloc(1,0x48);
  pCVar6->pMan = p;
  pCVar6->nLiterals = iVar13;
  pCVar6->nClauses = iVar15;
  ppiVar7 = (int **)malloc((long)(iVar17 * 3 + 2) << 3);
  pCVar6->pClauses = ppiVar7;
  lVar14 = (long)iVar13;
  piVar8 = (int *)malloc(lVar14 * 4);
  *ppiVar7 = piVar8;
  ppiVar7[iVar15] = piVar8 + lVar14;
  pVVar12 = p->vObjs;
  iVar13 = pVVar12->nSize;
  lVar16 = (long)iVar13;
  piVar8 = (int *)malloc(lVar16 * 4);
  pCVar6->pVarNums = piVar8;
  auVar5 = _DAT_0094e250;
  if (0 < lVar16) {
    lVar10 = lVar16 + -1;
    auVar18._8_4_ = (int)lVar10;
    auVar18._0_8_ = lVar10;
    auVar18._12_4_ = (int)((ulong)lVar10 >> 0x20);
    lVar10 = 0;
    auVar18 = auVar18 ^ _DAT_0094e250;
    auVar19 = _DAT_0094f530;
    auVar21 = _DAT_0094e240;
    do {
      auVar22 = auVar21 ^ auVar5;
      iVar17 = auVar18._4_4_;
      if ((bool)(~(auVar22._4_4_ == iVar17 && auVar18._0_4_ < auVar22._0_4_ ||
                  iVar17 < auVar22._4_4_) & 1)) {
        *(undefined4 *)((long)piVar8 + lVar10) = 0xffffffff;
      }
      if ((auVar22._12_4_ != auVar18._12_4_ || auVar22._8_4_ <= auVar18._8_4_) &&
          auVar22._12_4_ <= auVar18._12_4_) {
        *(undefined4 *)((long)piVar8 + lVar10 + 4) = 0xffffffff;
      }
      auVar22 = auVar19 ^ auVar5;
      iVar23 = auVar22._4_4_;
      if (iVar23 <= iVar17 && (iVar23 != iVar17 || auVar22._0_4_ <= auVar18._0_4_)) {
        *(undefined4 *)((long)piVar8 + lVar10 + 8) = 0xffffffff;
        *(undefined4 *)((long)piVar8 + lVar10 + 0xc) = 0xffffffff;
      }
      lVar20 = auVar21._8_8_;
      auVar21._0_8_ = auVar21._0_8_ + 4;
      auVar21._8_8_ = lVar20 + 4;
      lVar20 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 4;
      auVar19._8_8_ = lVar20 + 4;
      lVar10 = lVar10 + 0x10;
    } while ((ulong)(iVar13 + 3U >> 2) << 4 != lVar10);
  }
  pVVar2 = p->vCos;
  if (pVVar2->nSize < 1) {
    iVar17 = 1;
  }
  else {
    ppvVar3 = pVVar2->pArray;
    lVar10 = 0;
    do {
      ppvVar1 = ppvVar3 + lVar10;
      lVar10 = lVar10 + 1;
      piVar8[*(int *)((long)*ppvVar1 + 0x24)] = (int)lVar10;
    } while (lVar10 < pVVar2->nSize);
    iVar17 = (int)lVar10 + 1;
  }
  if (0 < iVar13) {
    ppvVar3 = pVVar12->pArray;
    lVar10 = 0;
    do {
      pvVar4 = ppvVar3[lVar10];
      if ((pvVar4 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar4 + 0x18) & 7) - 7)) {
        piVar8[*(int *)((long)pvVar4 + 0x24)] = iVar17;
        iVar17 = iVar17 + 1;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < lVar16);
  }
  pVVar2 = p->vCis;
  if (0 < pVVar2->nSize) {
    ppvVar3 = pVVar2->pArray;
    lVar16 = 0;
    do {
      piVar8[*(int *)((long)ppvVar3[lVar16] + 0x24)] = iVar17 + (int)lVar16;
      lVar16 = lVar16 + 1;
    } while (lVar16 < pVVar2->nSize);
    iVar17 = iVar17 + (int)lVar16;
  }
  pAVar11 = p->pConst1;
  piVar8[pAVar11->Id] = iVar17;
  pCVar6->nVars = iVar17 + 1;
  piVar9 = *ppiVar7;
  if (0 < iVar13) {
    lVar16 = 0;
    do {
      pvVar4 = pVVar12->pArray[lVar16];
      if ((pvVar4 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar4 + 0x18) & 7) - 7)) {
        piVar8 = pCVar6->pVarNums;
        iVar13 = piVar8[*(int *)((long)pvVar4 + 0x24)];
        iVar17 = piVar8[*(int *)((*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe) + 0x24)];
        iVar23 = piVar8[*(int *)((*(ulong *)((long)pvVar4 + 0x10) & 0xfffffffffffffffe) + 0x24)];
        *ppiVar7 = piVar9;
        *piVar9 = iVar13 * 2;
        piVar9[1] = (*(uint *)((long)pvVar4 + 8) & 1) + iVar17 * 2 ^ 1;
        piVar9[2] = (*(uint *)((long)pvVar4 + 0x10) & 1) + iVar23 * 2 ^ 1;
        ppiVar7[1] = piVar9 + 3;
        iVar13 = iVar13 * 2 + 1;
        piVar9[3] = iVar13;
        piVar9[4] = (*(uint *)((long)pvVar4 + 8) & 1) + iVar17 * 2;
        ppiVar7[2] = piVar9 + 5;
        ppiVar7 = ppiVar7 + 3;
        piVar9[5] = iVar13;
        piVar9[6] = (*(uint *)((long)pvVar4 + 0x10) & 1) + iVar23 * 2;
        piVar9 = piVar9 + 7;
        pVVar12 = p->vObjs;
      }
      lVar16 = lVar16 + 1;
      iVar13 = pVVar12->nSize;
    } while (lVar16 < iVar13);
    piVar8 = pCVar6->pVarNums;
    pAVar11 = p->pConst1;
  }
  iVar17 = piVar8[pAVar11->Id];
  if (iVar13 < iVar17) {
    __assert_fail("OutVar <= Aig_ManObjNumMax(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                  ,0x304,"Cnf_Dat_t *Cnf_DeriveSimpleForRetiming(Aig_Man_t *)");
  }
  *ppiVar7 = piVar9;
  ppiVar7 = ppiVar7 + 1;
  *piVar9 = iVar17 * 2;
  piVar9 = piVar9 + 1;
  pVVar12 = p->vCos;
  if (0 < pVVar12->nSize) {
    lVar16 = 0;
    do {
      pvVar4 = pVVar12->pArray[lVar16];
      iVar17 = pCVar6->pVarNums
               [*(int *)((*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe) + 0x24)];
      iVar13 = pCVar6->pVarNums[*(int *)((long)pvVar4 + 0x24)];
      *ppiVar7 = piVar9;
      *piVar9 = iVar13 * 2;
      piVar9[1] = (*(uint *)((long)pvVar4 + 8) & 1) + iVar17 * 2 ^ 1;
      ppiVar7[1] = piVar9 + 2;
      iVar13 = iVar13 * 2 + 1;
      piVar9[2] = iVar13;
      piVar9[3] = (*(uint *)((long)pvVar4 + 8) & 1) + iVar17 * 2;
      ppiVar7[2] = piVar9 + 4;
      ppiVar7 = ppiVar7 + 3;
      piVar9[4] = iVar13;
      piVar9 = piVar9 + 5;
      lVar16 = lVar16 + 1;
      pVVar12 = p->vCos;
    } while (lVar16 < pVVar12->nSize);
  }
  if ((long)piVar9 - (long)*pCVar6->pClauses >> 2 != lVar14) {
    __assert_fail("pLits - pCnf->pClauses[0] == nLiterals",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                  ,0x31b,"Cnf_Dat_t *Cnf_DeriveSimpleForRetiming(Aig_Man_t *)");
  }
  if ((long)ppiVar7 - (long)pCVar6->pClauses >> 3 != (long)iVar15) {
    __assert_fail("pClas - pCnf->pClauses == nClauses",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                  ,0x31c,"Cnf_Dat_t *Cnf_DeriveSimpleForRetiming(Aig_Man_t *)");
  }
  return pCVar6;
}

Assistant:

Cnf_Dat_t * Cnf_DeriveSimpleForRetiming( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    Cnf_Dat_t * pCnf;
    int OutVar, PoVar, pVars[32], * pLits, ** pClas;
    int i, nLiterals, nClauses, Number;

    // count the number of literals and clauses
    nLiterals = 1 + 7 * Aig_ManNodeNum(p) + 5 * Aig_ManCoNum(p);
    nClauses = 1 + 3 * Aig_ManNodeNum(p) + 3 * Aig_ManCoNum(p);

    // allocate CNF
    pCnf = ABC_ALLOC( Cnf_Dat_t, 1 );
    memset( pCnf, 0, sizeof(Cnf_Dat_t) );
    pCnf->pMan = p;
    pCnf->nLiterals = nLiterals;
    pCnf->nClauses = nClauses;
    pCnf->pClauses = ABC_ALLOC( int *, nClauses + 1 );
    pCnf->pClauses[0] = ABC_ALLOC( int, nLiterals );
    pCnf->pClauses[nClauses] = pCnf->pClauses[0] + nLiterals;

    // create room for variable numbers
    pCnf->pVarNums = ABC_ALLOC( int, Aig_ManObjNumMax(p) );
//    memset( pCnf->pVarNums, 0xff, sizeof(int) * Aig_ManObjNumMax(p) );
    for ( i = 0; i < Aig_ManObjNumMax(p); i++ )
        pCnf->pVarNums[i] = -1;
    // assign variables to the last (nOutputs) POs
    Number = 1;
    Aig_ManForEachCo( p, pObj, i )
        pCnf->pVarNums[pObj->Id] = Number++;
    // assign variables to the internal nodes
    Aig_ManForEachNode( p, pObj, i )
        pCnf->pVarNums[pObj->Id] = Number++;
    // assign variables to the PIs and constant node
    Aig_ManForEachCi( p, pObj, i )
        pCnf->pVarNums[pObj->Id] = Number++;
    pCnf->pVarNums[Aig_ManConst1(p)->Id] = Number++;
    pCnf->nVars = Number;
    // assign the clauses
    pLits = pCnf->pClauses[0];
    pClas = pCnf->pClauses;
    Aig_ManForEachNode( p, pObj, i )
    {
        OutVar   = pCnf->pVarNums[ pObj->Id ];
        pVars[0] = pCnf->pVarNums[ Aig_ObjFanin0(pObj)->Id ];
        pVars[1] = pCnf->pVarNums[ Aig_ObjFanin1(pObj)->Id ];

        // positive phase
        *pClas++ = pLits;
        *pLits++ = 2 * OutVar; 
        *pLits++ = 2 * pVars[0] + !Aig_ObjFaninC0(pObj); 
        *pLits++ = 2 * pVars[1] + !Aig_ObjFaninC1(pObj); 
        // negative phase
        *pClas++ = pLits;
        *pLits++ = 2 * OutVar + 1; 
        *pLits++ = 2 * pVars[0] + Aig_ObjFaninC0(pObj); 
        *pClas++ = pLits;
        *pLits++ = 2 * OutVar + 1; 
        *pLits++ = 2 * pVars[1] + Aig_ObjFaninC1(pObj); 
    }
 
    // write the constant literal
    OutVar = pCnf->pVarNums[ Aig_ManConst1(p)->Id ];
    assert( OutVar <= Aig_ManObjNumMax(p) );
    *pClas++ = pLits;
    *pLits++ = 2 * OutVar; 

    // write the output literals
    Aig_ManForEachCo( p, pObj, i )
    {
        OutVar = pCnf->pVarNums[ Aig_ObjFanin0(pObj)->Id ];
        PoVar  = pCnf->pVarNums[ pObj->Id ];
        // first clause
        *pClas++ = pLits;
        *pLits++ = 2 * PoVar; 
        *pLits++ = 2 * OutVar + !Aig_ObjFaninC0(pObj); 
        // second clause
        *pClas++ = pLits;
        *pLits++ = 2 * PoVar + 1; 
        *pLits++ = 2 * OutVar + Aig_ObjFaninC0(pObj); 
        // final clause (init-state is always 0 -> set the output to 0)
        *pClas++ = pLits;
        *pLits++ = 2 * PoVar + 1; 
    }

    // verify that the correct number of literals and clauses was written
    assert( pLits - pCnf->pClauses[0] == nLiterals );
    assert( pClas - pCnf->pClauses == nClauses );
    return pCnf;
}